

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O3

Score __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::CalculateVertexEnergy
          (ElectronOptimisationAlgorithm *this,ElnVertex *vert)

{
  ElectronOpt *pEVar1;
  ElnVertex pvVar2;
  void *pvVar3;
  void *pvVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  uint uVar8;
  ElnVertex pvVar9;
  ElnVertex pvVar10;
  _Rb_tree_node_base *p_Var11;
  ElectronOptimisationAlgorithm *pEVar12;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var13;
  Score *pSVar14;
  uint uVar15;
  long lVar16;
  byte bVar17;
  pointer ppVar18;
  key_type_conflict1 *__k;
  undefined4 uVar19;
  ElectronOptimisationAlgorithm *pEVar20;
  byte bVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  MolVertPair id;
  MolVertPair id_00;
  uint local_3c;
  key_type_conflict1 local_38;
  key_type_conflict1 local_34;
  
  pEVar1 = this->parent_;
  pvVar2 = *vert;
  pvVar3 = *(void **)((long)pvVar2 + 0x30);
  pvVar4 = *(void **)((long)pvVar2 + 0x38);
  ppVar6 = (pEVar1->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar22 = 0;
  ppVar5 = (pEVar1->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar20 = this;
  for (ppVar18 = ppVar5; ppVar18 != ppVar6; ppVar18 = ppVar18 + 1) {
    pEVar20 = (ElectronOptimisationAlgorithm *)
              (ulong)(ppVar18->second == pvVar4 && ppVar18->first == pvVar3);
    lVar22 = (long)&pEVar20->_vptr_ElectronOptimisationAlgorithm + lVar22;
  }
  if (pvVar3 == pvVar4) {
    if ((((Options::AssignElectrons::ALLOW_CHARGED_CARBON) ||
         (*(char *)((long)pvVar2 + 0x45) != '\x06')) || (*(char *)((long)pvVar2 + 0x4a) == '\0')) &&
       ((Options::AssignElectrons::HIGHEST_MAGNITUDE_CHARGE == 0 ||
        (bVar17 = (char)*(byte *)((long)pvVar2 + 0x4a) >> 7,
        (byte)((*(byte *)((long)pvVar2 + 0x4a) ^ bVar17) - bVar17) <=
        Options::AssignElectrons::HIGHEST_MAGNITUDE_CHARGE)))) {
      bVar21 = *(char *)((long)pvVar2 + 0x47) + *(char *)((long)pvVar2 + 0x46);
      bVar17 = 1;
      for (pEVar12 = *(ElectronOptimisationAlgorithm **)((long)pvVar2 + 0x18);
          pEVar12 != (ElectronOptimisationAlgorithm *)((long)pvVar2 + 8);
          pEVar12 = (ElectronOptimisationAlgorithm *)
                    std::_Rb_tree_increment((_Rb_tree_node_base *)pEVar12)) {
        ppVar7 = (pEVar12->minDistributions_).
                 super__Vector_base<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (ppVar5 != ppVar6) {
          lVar16 = 0;
          ppVar18 = ppVar5;
          do {
            auVar23._0_4_ =
                 -(uint)(*(int *)&ppVar18->first ==
                        *(int *)&ppVar7[1].first.m_bits.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
            auVar23._4_4_ =
                 -(uint)(*(int *)((long)&ppVar18->first + 4) ==
                        *(int *)((long)&ppVar7[1].first.m_bits.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 4));
            auVar23._8_4_ =
                 -(uint)(*(int *)&ppVar18->second ==
                        *(int *)&ppVar7[1].first.m_bits.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            auVar23._12_4_ =
                 -(uint)(*(int *)((long)&ppVar18->second + 4) ==
                        *(int *)((long)&ppVar7[1].first.m_bits.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
            auVar24._4_4_ = auVar23._0_4_;
            auVar24._0_4_ = auVar23._4_4_;
            auVar24._8_4_ = auVar23._12_4_;
            auVar24._12_4_ = auVar23._8_4_;
            uVar19 = movmskpd((int)pEVar20,auVar24 & auVar23);
            pEVar20 = (ElectronOptimisationAlgorithm *)
                      ((ulong)CONCAT31((int3)((uint)uVar19 >> 8),~(byte)uVar19) & 0xffffffffffffff03
                      );
            lVar16 = lVar16 + (ulong)((char)pEVar20 == '\0');
            ppVar18 = ppVar18 + 1;
          } while (ppVar18 != ppVar6);
          if (lVar16 != 0) {
            bVar17 = 0;
          }
        }
        bVar21 = bVar21 + *(char *)((long)&ppVar7[1].first.m_num_bits + 6) +
                 *(char *)((long)&ppVar7[1].first.m_num_bits + 7);
        pEVar20 = pEVar12;
      }
      if ((bool)(lVar22 == 0 & bVar17)) {
        return 0;
      }
      if (*(ulong *)((long)pvVar2 + 0x28) < 3) {
        bVar17 = *(byte *)((long)pvVar2 + 0x48);
      }
      else {
        bVar17 = *(byte *)((long)pvVar2 + 0x49);
      }
      if (bVar21 <= bVar17) {
        bVar17 = *(byte *)((long)pvVar2 + 0x4a);
        uVar15 = (uint)CONCAT11((bVar17 ^ (char)bVar17 >> 7) - ((char)bVar17 >> 7),
                                *(undefined1 *)((long)pvVar2 + 0x45));
        uVar8 = uVar15 ^ 0x8000;
        if (-1 < (char)bVar17) {
          uVar8 = uVar15;
        }
        __k = &local_34;
LAB_0011e3c9:
        *__k = uVar8;
        _Var13._M_cur =
             (__node_type *)
             std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(pEVar1->scores_)._M_h,__k);
        if (_Var13._M_cur != (__node_type *)0x0) goto LAB_0011e3ed;
      }
    }
  }
  else {
    if ((lVar22 == 0) && (!Options::AssignElectrons::USE_CHARGED_BOND_ENERGIES)) {
      return 0;
    }
    id.second = pvVar3;
    id.first = pvVar3;
    pvVar9 = ElectronGraph::GetVertex
                       ((pEVar1->elnGraph_).
                        super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,id);
    id_00.second = pvVar4;
    id_00.first = pvVar4;
    pvVar10 = ElectronGraph::GetVertex
                        ((this->parent_->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,id_00);
    pEVar1 = this->parent_;
    bVar17 = *(char *)((long)pvVar9 + 0x47) + *(char *)((long)pvVar9 + 0x46);
    for (p_Var11 = *(_Rb_tree_node_base **)((long)pvVar9 + 0x18);
        p_Var11 != (_Rb_tree_node_base *)((long)pvVar9 + 8);
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      bVar17 = bVar17 + *(char *)(*(long *)(p_Var11 + 1) + 0x46) +
               *(char *)(*(long *)(p_Var11 + 1) + 0x47);
    }
    if (*(ulong *)((long)pvVar9 + 0x28) < 3) {
      bVar21 = *(byte *)((long)pvVar9 + 0x48);
    }
    else {
      bVar21 = *(byte *)((long)pvVar9 + 0x49);
    }
    if (bVar17 <= bVar21) {
      bVar17 = *(char *)((long)pvVar10 + 0x47) + *(char *)((long)pvVar10 + 0x46);
      for (p_Var11 = *(_Rb_tree_node_base **)((long)pvVar10 + 0x18);
          p_Var11 != (_Rb_tree_node_base *)((long)pvVar10 + 8);
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        bVar17 = bVar17 + *(char *)(*(long *)(p_Var11 + 1) + 0x46) +
                 *(char *)(*(long *)(p_Var11 + 1) + 0x47);
      }
      if (*(ulong *)((long)pvVar10 + 0x28) < 3) {
        bVar21 = *(byte *)((long)pvVar10 + 0x48);
      }
      else {
        bVar21 = *(byte *)((long)pvVar10 + 0x49);
      }
      if (bVar17 <= bVar21) {
        local_3c = (uint)CONCAT11(*(undefined1 *)((long)pvVar10 + 0x45),
                                  *(undefined1 *)((long)pvVar9 + 0x45));
        if (Options::AssignElectrons::USE_CHARGED_BOND_ENERGIES == true) {
          uVar8 = local_3c + 0x10000;
          if (*(char *)((long)pvVar9 + 0x4a) == '\0') {
            uVar8 = local_3c;
          }
          if (*(char *)((long)pvVar9 + 0x4a) < '\0') {
            uVar8 = local_3c + 0x20000;
          }
          if (*(char *)((long)pvVar10 + 0x4a) < '\0') {
            local_3c = uVar8 | 0x80000;
          }
          else {
            local_3c = uVar8 + 0x40000;
            if (*(char *)((long)pvVar10 + 0x4a) == '\0') {
              local_3c = uVar8;
            }
          }
        }
        local_3c = ((uint)*(byte *)((long)pvVar2 + 0x47) + (uint)*(byte *)((long)pvVar2 + 0x46)) *
                   0x100000 | local_3c;
        _Var13._M_cur =
             (__node_type *)
             std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(pEVar1->scores_)._M_h,&local_3c);
        if (_Var13._M_cur == (__node_type *)0x0) {
          pEVar1 = this->parent_;
          uVar8 = this->eneBitmask_ & local_3c;
          __k = &local_38;
          goto LAB_0011e3c9;
        }
LAB_0011e3ed:
        pSVar14 = (Score *)((long)&((_Var13._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>
                                   ._M_storage._M_storage + 4);
        goto LAB_0011e3dc;
      }
    }
  }
  pSVar14 = &Options::AssignElectrons::INF;
LAB_0011e3dc:
  return *pSVar14;
}

Assistant:

Score ElectronOptimisationAlgorithm::CalculateVertexEnergy(ElnVertex& vert) {
  ElnVertProp* prop = parent_->elnGraph_->GetProperties(vert);
  MolVertPair id = prop->id;
  size_t idCount = std::count(parent_->possibleLocations_.begin(),
                              parent_->possibleLocations_.end(), id);
  
  if (id.first == id.second) { // Atom energies
    if (!opt_::ALLOW_CHARGED_CARBON && prop->atomic_number == 6
        && prop->formal_charge != 0) {
      return opt_::INF;
    }
    if (opt_::HIGHEST_MAGNITUDE_CHARGE > 0
        && (size_t)abs(prop->formal_charge) > opt_::HIGHEST_MAGNITUDE_CHARGE) {
      return opt_::INF;
    }
    uint8_t valence = prop->electron_count + prop->pre_placed;
    bool allZero = true;
    ElnNbrsIterPair nbrs = parent_->elnGraph_->GetNeighbours(vert);
    for (ElnNeighboursIter n = nbrs.first; n != nbrs.second; ++n) {
      ElnVertProp* p = parent_->elnGraph_->GetProperties(*n);
      if (std::count(parent_->possibleLocations_.begin(),
                     parent_->possibleLocations_.end(), p->id) != 0) allZero = false;
      valence += p->electron_count + p->pre_placed;
    }
    
    if (idCount == 0 && allZero) return 0;
    
    if ((parent_->elnGraph_->Degree(vert) > 2
         && valence > prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(vert) <= 2
            && valence > prop->target_octet)){
      return opt_::INF;
    }
    
    
    uint16_t k = prop->atomic_number + (abs(prop->formal_charge) << 8);
    if (prop->formal_charge < 0)
      k += (1 << 15);
    auto pos = parent_->scores_.find(k);
    if (pos == parent_->scores_.end())
      return opt_::INF;
    else
      return pos->second;
    
  } else { // Bond energies
    if (!opt_::USE_CHARGED_BOND_ENERGIES && idCount == 0) return 0;
    ElnVertex u = parent_->elnGraph_->GetVertex(std::make_pair(id.first, id.first));
    ElnVertex v = parent_->elnGraph_->GetVertex(std::make_pair(id.second, id.second));
    ElnVertProp* u_prop = parent_->elnGraph_->GetProperties(u);
    ElnVertProp* v_prop = parent_->elnGraph_->GetProperties(v);
    
    // check valence state of both atoms
    uint8_t valence_u = u_prop->electron_count + u_prop->pre_placed;
    ElnNbrsIterPair nbrs_u = parent_->elnGraph_->GetNeighbours(u);
    for (; nbrs_u.first != nbrs_u.second; ++nbrs_u.first) {
      ElnVertProp* tmpP = parent_->elnGraph_->GetProperties(*nbrs_u.first);
      valence_u += tmpP->electron_count + tmpP->pre_placed;
    }
    if ((parent_->elnGraph_->Degree(u) > 2
         && valence_u > u_prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(u) <= 2
            && valence_u > u_prop->target_octet)) {
      return opt_::INF;
    }
    
    uint8_t valence_v = v_prop->electron_count + v_prop->pre_placed;
    ElnNbrsIterPair nbrs_v = parent_->elnGraph_->GetNeighbours(v);
    for (; nbrs_v.first != nbrs_v.second; ++nbrs_v.first) {
      ElnVertProp* tmpP = parent_->elnGraph_->GetProperties(*nbrs_v.first);
      valence_v += tmpP->electron_count + tmpP->pre_placed;
    }
    if ((parent_->elnGraph_->Degree(v) > 2
         && valence_v > v_prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(v) <= 2
            && valence_v > v_prop->target_octet)) {
      return opt_::INF;
    }
    
    uint32_t k = 0;
    k += u_prop->atomic_number;
    k += (v_prop->atomic_number << 8);
    if (opt_::USE_CHARGED_BOND_ENERGIES){
      if (u_prop->formal_charge < 0)
        k += (2 << 16);
      else if (u_prop->formal_charge > 0)
        k += (1 << 16);
      if (v_prop->formal_charge < 0)
        k += (2 << 18);
      else if (v_prop->formal_charge > 0)
        k += (1 << 18);
    }
    k += ((prop->electron_count + prop->pre_placed) << 20);
    
    auto pos = parent_->scores_.find(k);
    
    if (pos != parent_->scores_.end())
      return pos->second;
    
    pos = parent_->scores_.find(k & eneBitmask_);
    if (pos != parent_->scores_.end())
      return pos->second;
    else
      return opt_::INF;
  }
}